

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O0

bool __thiscall RTIMUMPU9150::IMUInit(RTIMUMPU9150 *this)

{
  bool bVar1;
  byte local_19;
  RTIMUMPU9150 *pRStack_18;
  uchar result;
  RTIMUMPU9150 *this_local;
  
  this->m_firstTime = true;
  this->m_cacheCount = 0;
  this->m_cacheOut = 0;
  this->m_cacheIn = 0;
  (this->super_RTIMU).m_imuData.fusionPoseValid = false;
  (this->super_RTIMU).m_imuData.fusionQPoseValid = false;
  (this->super_RTIMU).m_imuData.gyroValid = true;
  (this->super_RTIMU).m_imuData.accelValid = true;
  (this->super_RTIMU).m_imuData.compassValid = true;
  (this->super_RTIMU).m_imuData.pressureValid = false;
  (this->super_RTIMU).m_imuData.temperatureValid = false;
  (this->super_RTIMU).m_imuData.humidityValid = false;
  this->m_slaveAddr = ((this->super_RTIMU).m_settings)->m_I2CSlaveAddress;
  pRStack_18 = this;
  setSampleRate(this,((this->super_RTIMU).m_settings)->m_MPU9150GyroAccelSampleRate);
  setCompassRate(this,((this->super_RTIMU).m_settings)->m_MPU9150CompassSampleRate);
  setLpf(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150GyroAccelLpf);
  setGyroFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150GyroFsr);
  setAccelFsr(this,(uchar)((this->super_RTIMU).m_settings)->m_MPU9150AccelFsr);
  RTIMU::setCalibrationData(&this->super_RTIMU);
  bVar1 = RTIMUHal::HALOpen(&((this->super_RTIMU).m_settings)->super_RTIMUHal);
  if (bVar1) {
    bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,
                               'k',0x80,"Failed to initiate MPU9150 reset");
    if (bVar1) {
      RTIMUHal::delayMs(&((this->super_RTIMU).m_settings)->super_RTIMUHal,100);
      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr
                                 ,'k','\0',"Failed to stop MPU9150 reset");
      if (bVar1) {
        bVar1 = RTIMUHal::HALRead(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                  this->m_slaveAddr,'u','\x01',&local_19,"Failed to read MPU9150 id"
                                 );
        if (bVar1) {
          if (local_19 == 0x68) {
            bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                       this->m_slaveAddr,'\x1a',this->m_lpf,"Failed to set lpf");
            if (bVar1) {
              bVar1 = setSampleRate(this);
              if (bVar1) {
                bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                           this->m_slaveAddr,'\x1b',this->m_gyroFsr,
                                           "Failed to set gyro fsr");
                if (bVar1) {
                  bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                             this->m_slaveAddr,'\x1c',this->m_accelFsr,
                                             "Failed to set accel fsr");
                  if (bVar1) {
                    bVar1 = configureCompass(this);
                    if (bVar1) {
                      bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,
                                                 this->m_slaveAddr,'k','\x01',
                                                 "Failed to set pwr_mgmt_1");
                      if (bVar1) {
                        bVar1 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal
                                                   ,this->m_slaveAddr,'l','\0',
                                                   "Failed to set pwr_mgmt_2");
                        if (bVar1) {
                          bVar1 = resetFifo(this);
                          if (bVar1) {
                            RTIMU::gyroBiasInit(&this->super_RTIMU);
                            printf("%s","MPU9150 init complete\n");
                            fflush(_stdout);
                            this_local._7_1_ = true;
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            fprintf(_stderr,"Incorrect MPU9150 id %d\n",(ulong)local_19);
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool RTIMUMPU9150::IMUInit()
{
    unsigned char result;

    m_firstTime = true;

#ifdef MPU9150_CACHE_MODE
    m_cacheIn = m_cacheOut = m_cacheCount = 0;
#endif

    // set validity flags

    m_imuData.fusionPoseValid = false;
    m_imuData.fusionQPoseValid = false;
    m_imuData.gyroValid = true;
    m_imuData.accelValid = true;
    m_imuData.compassValid = true;
    m_imuData.pressureValid = false;
    m_imuData.temperatureValid = false;
    m_imuData.humidityValid = false;

    //  configure IMU

    m_slaveAddr = m_settings->m_I2CSlaveAddress;

    setSampleRate(m_settings->m_MPU9150GyroAccelSampleRate);
    setCompassRate(m_settings->m_MPU9150CompassSampleRate);
    setLpf(m_settings->m_MPU9150GyroAccelLpf);
    setGyroFsr(m_settings->m_MPU9150GyroFsr);
    setAccelFsr(m_settings->m_MPU9150AccelFsr);

    setCalibrationData();

    //  enable the I2C bus

    if (!m_settings->HALOpen())
        return false;

    //  reset the MPU9150

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 0x80, "Failed to initiate MPU9150 reset"))
        return false;

    m_settings->delayMs(100);

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 0x00, "Failed to stop MPU9150 reset"))
        return false;

    if (!m_settings->HALRead(m_slaveAddr, MPU9150_WHO_AM_I, 1, &result, "Failed to read MPU9150 id"))
        return false;

    if (result != MPU9150_ID) {
        HAL_ERROR1("Incorrect MPU9150 id %d\n", result);
        return false;
    }

    //  now configure the various components

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_LPF_CONFIG, m_lpf, "Failed to set lpf"))
        return false;

    if (!setSampleRate())
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_GYRO_CONFIG, m_gyroFsr, "Failed to set gyro fsr"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_ACCEL_CONFIG, m_accelFsr, "Failed to set accel fsr"))
         return false;

    //  now configure compass

    if (!configureCompass())
        return false;

    //  enable the sensors

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_1, 1, "Failed to set pwr_mgmt_1"))
        return false;

    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_PWR_MGMT_2, 0, "Failed to set pwr_mgmt_2"))
         return false;

    //  select the data to go into the FIFO and enable

    if (!resetFifo())
        return false;

    gyroBiasInit();

    HAL_INFO("MPU9150 init complete\n");
    return true;
}